

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall helics::apps::Source::Source(Source *this,int argc,char **argv)

{
  undefined8 *in_RDI;
  char **in_stack_000001a0;
  int in_stack_000001ac;
  App *in_stack_000001b0;
  undefined1 in_stack_000001b8 [16];
  Source *in_stack_00000460;
  undefined8 *t;
  Source *this_00;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  App::App(in_stack_000001b0,(string_view)in_stack_000001b8,in_stack_000001ac,in_stack_000001a0);
  *in_RDI = &PTR__Source_009be350;
  CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::deque
            ((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
             0x23578e);
  t = in_RDI + 0x1e;
  CLI::std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
            *)0x2357a5);
  this_00 = (Source *)(in_RDI + 0x21);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x2357bb);
  CLI::std::vector<helics::Endpoint,_std::allocator<helics::Endpoint>_>::vector
            ((vector<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x2357d1);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x2357e7);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)this_00,(double)t);
  processArgs(in_stack_00000460);
  initialSetup(this_00);
  return;
}

Assistant:

Source::Source(int argc, char* argv[]): App("source_${#}", argc, argv)
    {
        processArgs();
        initialSetup();
    }